

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlPass::DebugEngineCode(GdlPass *this,GrcManager *pcman,uint32_t fxdRuleVersion,ostream *strmOut)

{
  int iVar1;
  ostream *poVar2;
  uint32_t uVar3;
  GrcManager *pGVar4;
  ulong uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbPassConstraints;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  iVar1 = this->m_nGlobalID + 1 + this->m_nPreBidiPass;
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nPASS: ",7);
  poVar2 = (ostream *)std::ostream::operator<<(strmOut,iVar1);
  pGVar4 = (GrcManager *)0x2082e9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenerateEngineCode(this,pGVar4,fxdRuleVersion,&local_48);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nPASS CONSTRAINTS: none\n",0x18);
  }
  else {
    uVar3 = 0x204552;
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nPASS CONSTRAINTS:\n",0x13);
    GdlRule::DebugEngineCode(&local_48,uVar3,strmOut);
  }
  if ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nNO RULES\n",10);
  }
  if ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nRULE ",6);
      poVar2 = (ostream *)std::ostream::operator<<(strmOut,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      GrpLineAndFile::WriteToStream
                ((GrpLineAndFile *)
                 (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],strmOut,true);
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,":  ",3);
      GdlRule::RulePrettyPrint
                ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],pcman,strmOut,false);
      std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\n",1);
      GdlRule::DebugEngineCode
                ((this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],pcman,fxdRuleVersion,strmOut);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->m_vprule).
                                   super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)(this->m_vprule).
                                   super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 3));
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GdlPass::DebugEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion, std::ostream & strmOut)
{
	int nPassNum = PassDebuggerNumber();
	strmOut << "\nPASS: " << nPassNum << "\n";

	std::vector<gr::byte> vbPassConstraints;
	GenerateEngineCode(pcman, fxdRuleVersion, vbPassConstraints);
	if (vbPassConstraints.size() == 0)
	{
		strmOut << "\nPASS CONSTRAINTS: none\n";
	}
	else
	{
		strmOut << "\nPASS CONSTRAINTS:\n";
		GdlRule::DebugEngineCode(vbPassConstraints, fxdRuleVersion, strmOut);
	}

	if (m_vprule.size() == 0)
		strmOut << "\nNO RULES\n";

	for (size_t iprul = 0; iprul < m_vprule.size(); iprul++)
	{
		strmOut << "\nRULE " << nPassNum << "." << iprul << ", ";
		m_vprule[iprul]->LineAndFile().WriteToStream(strmOut, true);
		strmOut << ":  ";

		m_vprule[iprul]->RulePrettyPrint(pcman, strmOut, false);
		strmOut << "\n";
		m_vprule[iprul]->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
	}
}